

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O0

void __thiscall diffusion::ShmReader::ShmReader(ShmReader *this,string *shm_name)

{
  undefined8 uVar1;
  char *pcVar2;
  size_t sVar3;
  string *shm_name_local;
  ShmReader *this_local;
  
  Reader::Reader(&this->super_Reader);
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR_can_read_00113cc8;
  uVar1 = std::__cxx11::string::c_str();
  boost::interprocess::shared_memory_object::shared_memory_object(&this->shm_object_,uVar1,0);
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
            (&this->shm_region_,&this->shm_object_,read_only,0,0,(void *)0x0,-1);
  this->reader_shm_body_offset_ = 0;
  pcVar2 = (char *)boost::interprocess::mapped_region::get_address(&this->shm_region_);
  this->shm_header_position_ = pcVar2;
  this->shm_body_position_ = this->shm_header_position_ + 8;
  sVar3 = boost::interprocess::mapped_region::get_size(&this->shm_region_);
  this->shm_body_size_ = (int)sVar3 + -8;
  update_writer_shm_body_offset(this);
  return;
}

Assistant:

ShmReader::ShmReader(std::string const & shm_name)
    : shm_object_(boost::interprocess::open_only, shm_name.c_str(), boost::interprocess::read_only),
      shm_region_(shm_object_, boost::interprocess::read_only),
      reader_shm_body_offset_(0) {
    shm_header_position_ = reinterpret_cast<char *>(shm_region_.get_address());
    shm_body_position_ = shm_header_position_ + kShmHeaderLength;
    shm_body_size_ = shm_region_.get_size() - kShmHeaderLength;
    this->update_writer_shm_body_offset();
}